

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_mod_2d(mp_int *a,int b,mp_int *c)

{
  ulong *puVar1;
  int iVar2;
  mp_digit *pmVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if (b < 1) {
    iVar5 = 0;
    c->sign = 0;
    c->used = 0;
    if (0 < (long)c->alloc) {
      iVar5 = 0;
      memset(c->dp,0,(long)c->alloc << 3);
    }
  }
  else {
    iVar2 = a->used;
    iVar5 = mp_copy(a,c);
    if (iVar5 == 0 && b < iVar2 * 0x3c) {
      uVar6 = (uint)b % 0x3c;
      uVar7 = c->used;
      if ((int)((uint)b / 0x3c + (uint)(uVar6 != 0)) < (int)uVar7) {
        memset((void *)((ulong)((((uint)b / 0x3c + 1) - (uint)(uVar6 == 0)) * 8) + (long)c->dp),0,
               (ulong)((~(uint)((ulong)(uint)b / 0x3c) + uVar7) - (uint)(uVar6 != 0)) * 8 + 8);
      }
      pmVar3 = c->dp;
      puVar1 = pmVar3 + (ulong)(uint)b / 0x3c;
      *puVar1 = *puVar1 & ~(-1L << (sbyte)uVar6);
      if (0 < (int)uVar7) {
        do {
          if (pmVar3[(ulong)uVar7 - 1] != 0) goto LAB_00104267;
          c->used = uVar7 - 1;
          bVar4 = 1 < (int)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar4);
        uVar7 = 0;
      }
LAB_00104267:
      iVar5 = 0;
      if (uVar7 == 0) {
        c->sign = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int mp_mod_2d (mp_int * a, int b, mp_int * c)
{
  int     x, res;

  /* if b is <= 0 then zero the int */
  if (b <= 0) {
    mp_zero (c);
    return MP_OKAY;
  }

  /* if the modulus is larger than the value than return */
  if (b >= (int) (a->used * DIGIT_BIT)) {
    res = mp_copy (a, c);
    return res;
  }

  /* copy */
  if ((res = mp_copy (a, c)) != MP_OKAY) {
    return res;
  }

  /* zero digits above the last digit of the modulus */
  for (x = (b / DIGIT_BIT) + ((b % DIGIT_BIT) == 0 ? 0 : 1); x < c->used; x++) {
    c->dp[x] = 0;
  }
  /* clear the digit that is not completely outside/inside the modulus */
  c->dp[b / DIGIT_BIT] &=
    (mp_digit) ((((mp_digit) 1) << (((mp_digit) b) % DIGIT_BIT)) - ((mp_digit) 1));
  mp_clamp (c);
  return MP_OKAY;
}